

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arg.cc
# Opt level: O3

bool absl::lts_20250127::str_format_internal::ConvertIntArg<absl::lts_20250127::int128>
               (int128 v,FormatConversionSpecImpl conv,FormatSinkImpl *sink)

{
  byte bVar1;
  ulong uVar2;
  bool bVar3;
  ulong uVar4;
  uint in_ECX;
  ulong uVar5;
  ulong uVar6;
  long lVar7;
  FormatSinkImpl *in_R8;
  uint uVar8;
  wchar_t v_00;
  double v_01;
  FormatConversionSpecImpl conv_00;
  FormatConversionSpecImpl conv_01;
  FormatConversionSpecImpl conv_02;
  uint128 v_02;
  uint128 v_03;
  string_view v_04;
  FormatSinkImpl *local_68 [2];
  undefined1 local_58 [64];
  
  uVar5 = CONCAT44((int)((ulong)register0x00000030 >> 0x20),conv.precision_);
  uVar4 = conv._0_8_;
  v_00 = (wchar_t)sink;
  local_68[0] = sink;
  switch((ulong)sink & 0xff) {
  case 0:
    conv_02.precision_ = (int)in_R8;
    if ((v_00 & 0xff0000U) != 0x20000) {
      conv_01.precision_ = conv_02.precision_;
      conv_01._0_8_ = sink;
      anon_unknown_53::ConvertCharImpl
                (conv.conv_,conv_01,(FormatSinkImpl *)(ulong)(uint)(v_00 & 0xff0000U));
      return true;
    }
    conv_02._0_8_ = (FormatSinkImpl *)CONCAT44(0,in_ECX);
    bVar3 = anon_unknown_53::ConvertWCharTImpl
                      ((anon_unknown_53 *)(uVar4 & 0xffffffff),v_00,conv_02,in_R8);
    return bVar3;
  default:
    __assert_fail("false",
                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O3/_deps/absl-src/absl/strings/internal/str_format/arg.cc"
                  ,0x1c2,
                  "bool absl::str_format_internal::ConvertIntArg(T, FormatConversionSpecImpl, FormatSinkImpl *) [T = absl::int128]"
                 );
  case 2:
  case 3:
  case 0x12:
    uVar6 = -(ulong)(uVar4 != 0) - uVar5;
    uVar2 = -uVar4;
    if (-1 < register0x00000030) {
      uVar6 = uVar5;
      uVar2 = uVar4;
    }
    uVar4 = uVar2;
    bVar3 = SUB81((ulong)register0x00000030 >> 0x3f,0);
    uVar5 = uVar6;
    break;
  case 4:
    lVar7 = 0;
    do {
      do {
        bVar1 = (byte)uVar4;
        uVar4 = uVar4 >> 3 | uVar5 << 0x3d;
        local_58[lVar7 + 0x3b] = bVar1 & 7 | 0x30;
        uVar6 = uVar5 >> 3;
        lVar7 = lVar7 + -1;
        bVar3 = 7 < uVar5;
        uVar5 = uVar6;
      } while (bVar3);
    } while (uVar4 != 0);
    goto LAB_0025187f;
  case 5:
    bVar3 = false;
    break;
  case 6:
    v_03.hi_ = uVar5;
    v_03.lo_ = uVar4;
    anon_unknown_53::IntDigits::PrintAsHexLower<absl::lts_20250127::uint128>
              ((IntDigits *)local_58,v_03);
    goto LAB_002518c9;
  case 7:
    lVar7 = 0;
    do {
      do {
        uVar8 = (uint)uVar4;
        uVar4 = uVar4 >> 4 | uVar5 << 0x3c;
        local_58[lVar7 + 0x3b] = "0123456789ABCDEF"[uVar8 & 0xf];
        uVar6 = uVar5 >> 4;
        lVar7 = lVar7 + -1;
        bVar3 = 0xf < uVar5;
        uVar5 = uVar6;
      } while (bVar3);
    } while (uVar4 != 0);
LAB_0025187f:
    local_58._0_8_ = local_58 + lVar7 + 0x3c;
    local_58._8_8_ = -lVar7;
    goto LAB_002518c9;
  case 8:
  case 9:
  case 10:
  case 0xb:
  case 0xc:
  case 0xd:
  case 0xe:
  case 0xf:
    v_01 = (double)__floattidf(uVar4,uVar5);
    bVar3 = ConvertFloatImpl(v_01,(FormatConversionSpecImpl *)local_68,in_R8);
    return bVar3;
  }
  v_02.hi_ = uVar5;
  v_02.lo_ = uVar4;
  anon_unknown_53::IntDigits::PrintAsDec((IntDigits *)local_58,v_02,bVar3);
LAB_002518c9:
  if (((ulong)sink & 0xff00) == 0) {
    v_04._M_str = (char *)local_58._0_8_;
    v_04._M_len = local_58._8_8_;
    FormatSinkImpl::Append(in_R8,v_04);
  }
  else {
    conv_00.precision_ = v_00;
    conv_00.conv_ = local_58[8];
    conv_00.flags_ = local_58[9];
    conv_00.length_mod_ = local_58[10];
    conv_00._3_1_ = local_58[0xb];
    conv_00.width_ = local_58._12_4_;
    anon_unknown_53::ConvertIntImplInnerSlow
              ((IntDigits *)local_58._0_8_,conv_00,(FormatSinkImpl *)CONCAT44(0,in_ECX));
  }
  return true;
}

Assistant:

bool ConvertIntArg(T v, FormatConversionSpecImpl conv, FormatSinkImpl *sink) {
  using U = typename MakeUnsigned<T>::type;
  IntDigits as_digits;

  // This odd casting is due to a bug in -Wswitch behavior in gcc49 which causes
  // it to complain about a switch/case type mismatch, even though both are
  // FormatConversionChar.  Likely this is because at this point
  // FormatConversionChar is declared, but not defined.
  switch (static_cast<uint8_t>(conv.conversion_char())) {
    case static_cast<uint8_t>(FormatConversionCharInternal::c):
      return (std::is_same<T, wchar_t>::value ||
              (conv.length_mod() == LengthMod::l))
                 ? ConvertWCharTImpl(static_cast<wchar_t>(v), conv, sink)
                 : ConvertCharImpl(static_cast<char>(v), conv, sink);

    case static_cast<uint8_t>(FormatConversionCharInternal::o):
      as_digits.PrintAsOct(static_cast<U>(v));
      break;

    case static_cast<uint8_t>(FormatConversionCharInternal::x):
      as_digits.PrintAsHexLower(static_cast<U>(v));
      break;
    case static_cast<uint8_t>(FormatConversionCharInternal::X):
      as_digits.PrintAsHexUpper(static_cast<U>(v));
      break;

    case static_cast<uint8_t>(FormatConversionCharInternal::u):
      as_digits.PrintAsDec(static_cast<U>(v));
      break;

    case static_cast<uint8_t>(FormatConversionCharInternal::d):
    case static_cast<uint8_t>(FormatConversionCharInternal::i):
    case static_cast<uint8_t>(FormatConversionCharInternal::v):
      as_digits.PrintAsDec(v);
      break;

    case static_cast<uint8_t>(FormatConversionCharInternal::a):
    case static_cast<uint8_t>(FormatConversionCharInternal::e):
    case static_cast<uint8_t>(FormatConversionCharInternal::f):
    case static_cast<uint8_t>(FormatConversionCharInternal::g):
    case static_cast<uint8_t>(FormatConversionCharInternal::A):
    case static_cast<uint8_t>(FormatConversionCharInternal::E):
    case static_cast<uint8_t>(FormatConversionCharInternal::F):
    case static_cast<uint8_t>(FormatConversionCharInternal::G):
      return ConvertFloatImpl(static_cast<double>(v), conv, sink);

    default:
      ABSL_ASSUME(false);
  }

  if (conv.is_basic()) {
    sink->Append(as_digits.with_neg_and_zero());
    return true;
  }
  return ConvertIntImplInnerSlow(as_digits, conv, sink);
}